

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O1

SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
operator/(unsigned_short lhs,
         SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
         rhs)

{
  bool bVar1;
  undefined8 in_RAX;
  SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
  result;
  unsigned_short ret;
  undefined8 uStack_18;
  
  uStack_18._4_4_ = (undefined4)((ulong)in_RAX >> 0x20);
  uStack_18._0_2_ = (undefined2)in_RAX;
  uStack_18._0_4_ = CONCAT22(lhs,(undefined2)uStack_18);
  uStack_18 = CONCAT62(uStack_18._2_6_,(undefined2)uStack_18) & 0xffffffffffff00ff;
  bVar1 = DivisionCornerCaseHelper<signed_char,_unsigned_short,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>,_1>
          ::DivisionCornerCase1
                    (lhs,rhs,(SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
                              *)((long)&uStack_18 + 1));
  if (bVar1) {
    uStack_18._6_2_ = (ushort)uStack_18._1_1_;
  }
  else {
    uStack_18 = (ulong)CONCAT15(rhs.m_int,(int5)uStack_18);
    DivisionHelper<unsigned_short,signed_char,1>::
    DivideThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
              ((unsigned_short *)((long)&uStack_18 + 2),(char *)((long)&uStack_18 + 5),
               (unsigned_short *)((long)&uStack_18 + 6));
    if (0x7f < uStack_18._6_2_) {
      safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
    }
  }
  return (SafeInt<signed_char,_safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>_>
          )(char)uStack_18._6_2_;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}